

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_map_union.hh
# Opt level: O1

string * __thiscall
umu::_union_map_union_Union__0__::get_string_abi_cxx11_
          (string *__return_storage_ptr__,_union_map_union_Union__0__ *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 *puVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->idx_ == 0) {
    pbVar2 = boost::any_cast<std::__cxx11::string_const&>(&this->value_);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + pbVar2->_M_string_length);
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Invalid type for union","");
  std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)local_40);
  *puVar3 = 0x1c87a0;
  puVar3[1] = 0x1c87d0;
  __cxa_throw(puVar3,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
std::string _union_map_union_Union__0__::get_string() const {
    if (idx_ != 0) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::string >(value_);
}